

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar2;
  Nonnull<const_char_*> pcVar3;
  ExtensionSet *this_00;
  string_view str;
  LogMessage local_20;
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x346,"extension != nullptr");
    str._M_str = "Index out-of-bounds (field is empty).";
    str._M_len = 0x25;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
    goto LAB_0023fc0e;
  }
  if (pEVar1->is_repeated == false) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      this_00 = (ExtensionSet *)&local_20;
      MutableRepeatedMessage(this_00);
LAB_0023fbde:
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)this_00,10,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
    }
    else {
      this_00 = (ExtensionSet *)
                (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (this_00 != (ExtensionSet *)0xa) goto LAB_0023fbde;
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      pVVar2 = RepeatedPtrFieldBase::
               Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)pEVar1->field_0,index);
      return pVVar2;
    }
  }
  else {
    MutableRepeatedMessage();
  }
  MutableRepeatedMessage();
LAB_0023fc0e:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

MessageLite* ExtensionSet::MutableRepeatedMessage(int number, int index) {
  Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  return extension->ptr.repeated_message_value->Mutable(index);
}